

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

int * LoadRandomSequence(uint count,int min,int max)

{
  int *piVar1;
  uint32_t uVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  iVar5 = max - min;
  iVar7 = -iVar5;
  if (0 < iVar5) {
    iVar7 = iVar5;
  }
  uVar6 = 0;
  if (iVar7 + 1U < count) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)calloc((ulong)count,4);
LAB_0015a931:
    if (uVar6 < count) {
      uVar2 = rprand_xoshiro();
      iVar5 = uVar2 % (iVar7 + 1U) + min;
      uVar4 = 0;
      do {
        if (uVar6 == uVar4) {
          piVar3[uVar6] = iVar5;
          uVar6 = uVar6 + 1;
          break;
        }
        piVar1 = piVar3 + uVar4;
        uVar4 = uVar4 + 1;
      } while (*piVar1 != iVar5);
      goto LAB_0015a931;
    }
  }
  return piVar3;
}

Assistant:

int *LoadRandomSequence(unsigned int count, int min, int max)
{
    int *values = NULL;

#if defined(SUPPORT_RPRAND_GENERATOR)
    values = rprand_load_sequence(count, min, max);
#else
    if (count > ((unsigned int)abs(max - min) + 1)) return values;  // Security check

    values = (int *)RL_CALLOC(count, sizeof(int));

    int value = 0;
    bool dupValue = false;

    for (int i = 0; i < (int)count;)
    {
        value = (rand()%(abs(max - min) + 1) + min);
        dupValue = false;

        for (int j = 0; j < i; j++)
        {
            if (values[j] == value)
            {
                dupValue = true;
                break;
            }
        }

        if (!dupValue)
        {
            values[i] = value;
            i++;
        }
    }
#endif
    return values;
}